

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O3

bool DynamicProfileStorage::AppendCacheCatalog(char16 *url)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t *form;
  uint local_48;
  uint local_44;
  DWORD magic;
  DWORD version;
  DWORD count;
  DWORD time;
  DynamicProfileStorageReaderWriter catalogFile;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x339,"(enabled)","enabled");
    if (!bVar2) goto LAB_0096d74d;
    *puVar3 = 0;
  }
  if (useCacheDir == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x33a,"(useCacheDir)","useCacheDir");
    if (!bVar2) goto LAB_0096d74d;
    *puVar3 = 0;
  }
  if (locked == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x33b,"(locked)","locked");
    if (!bVar2) {
LAB_0096d74d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  _count = (char16 *)0x0;
  catalogFile.filename = (char16 *)0x0;
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)&count,catalogFilename,L"rcb+",false,
                     (errno_t *)0x0);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::Seek((DynamicProfileStorageReaderWriter *)&count,0);
    if (bVar2) {
      bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                        ((DynamicProfileStorageReaderWriter *)&count,&local_48,1);
      if (bVar2) {
        bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                          ((DynamicProfileStorageReaderWriter *)&count,&local_44,1);
        if (bVar2) {
          bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)&count,&version,1);
          if (bVar2) {
            bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                              ((DynamicProfileStorageReaderWriter *)&count,&magic,1);
            if (1 < local_44 && (local_48 == 0x132b5ae && bVar2)) {
              if (local_44 < 3) {
                if ((creationTime == (ulong)version) && (magic + 1 == nextFileId)) {
                  bVar2 = DynamicProfileStorageReaderWriter::SeekToEnd
                                    ((DynamicProfileStorageReaderWriter *)&count);
                  if (bVar2) {
                    bVar2 = DynamicProfileStorageReaderWriter::WriteUtf8String
                                      ((DynamicProfileStorageReaderWriter *)&count,url);
                    if (bVar2) {
                      bVar2 = DynamicProfileStorageReaderWriter::Seek
                                        ((DynamicProfileStorageReaderWriter *)&count,0xc);
                      if (bVar2) {
                        bVar2 = DynamicProfileStorageReaderWriter::WriteArray<unsigned_int_const>
                                          ((DynamicProfileStorageReaderWriter *)&count,&nextFileId,1
                                          );
                        if (bVar2) {
                          lastOffset = DynamicProfileStorageReaderWriter::Size
                                                 ((DynamicProfileStorageReaderWriter *)&count);
                          bVar2 = true;
                          goto LAB_0096d640;
                        }
                      }
                    }
                  }
                  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,DynamicProfileStoragePhase);
                  if (bVar2) {
                    Output::Print(
                                 L"TRACE: DynamicProfileStorage: Write failure. Cache directory catalog corrupted: \'%s\'\n"
                                 );
                    Output::Flush();
                  }
                  DynamicProfileStorageReaderWriter::Close
                            ((DynamicProfileStorageReaderWriter *)&count,false);
                  goto LAB_0096d639;
                }
                DisableCacheDir();
                form = L"ERROR: DynamicProfileStorage: Internal error, file modified under lock\n";
              }
              else {
                DisableCacheDir();
                form = L"ERROR: DynamicProfileStorage: Existing cache catalog has a newer format\n";
              }
              Output::Print(form);
              Output::Flush();
              bVar2 = false;
              goto LAB_0096d640;
            }
          }
        }
      }
    }
    DynamicProfileStorageReaderWriter::Close((DynamicProfileStorageReaderWriter *)&count,false);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,DynamicProfileStoragePhase);
    if (bVar2) {
      Output::Print(L"TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: \'%s\'\n"
                    ,catalogFilename);
      Output::Flush();
    }
  }
LAB_0096d639:
  bVar2 = CreateCacheCatalog();
LAB_0096d640:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)&count);
  return bVar2;
}

Assistant:

bool DynamicProfileStorage::AppendCacheCatalog(__in_z char16 const * url)
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    DWORD magic;
    DWORD version;
    DWORD count;
    DWORD time;
    DynamicProfileStorageReaderWriter catalogFile;
    if (!catalogFile.Init(catalogFilename, _u("rcb+"), false))
    {
        return CreateCacheCatalog();
    }

    if (!catalogFile.Seek(0)
        || !catalogFile.Read(&magic)
        || !catalogFile.Read(&version)
        || !catalogFile.Read(&time)
        || !catalogFile.Read(&count)
        || magic != MagicNumber
        || version < FileFormatVersion)
    {
        catalogFile.Close();
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: '%s'\n"), catalogFilename);
            Output::Flush();
        }
#endif
        return CreateCacheCatalog();
    }

    if (version > FileFormatVersion)
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Existing cache catalog has a newer format\n"));
        Output::Flush();
        return false;
    }

    if (time != creationTime || count + 1 != nextFileId)
    {
        // This should not happen, as we are under lock from the LoadCacheCatalog
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Internal error, file modified under lock\n"));
        Output::Flush();
        return false;
    }

    if (!catalogFile.SeekToEnd() ||
        !catalogFile.WriteUtf8String(url) ||
        !catalogFile.Seek(3 * sizeof(DWORD)) ||
        !catalogFile.Write(nextFileId))
    {
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Write failure. Cache directory catalog corrupted: '%s'\n"), catalogFilename);
            Output::Flush();
        }
#endif
        catalogFile.Close();
        return CreateCacheCatalog();
    }

    lastOffset = catalogFile.Size();
    return true;
}